

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleTorus.h
# Opt level: O0

void __thiscall
pzgeom::TPZTriangleTorus::X<Fad<double>>
          (TPZTriangleTorus *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *loc,
          TPZVec<Fad<double>_> *result)

{
  TPZVec<Fad<double>_> *in_RCX;
  TPZVec<Fad<double>_> *in_RDI;
  TPZVec<Fad<double>_> *in_stack_000000a0;
  TPZVec<Fad<double>_> *in_stack_000000a8;
  TPZFMatrix<double> *in_stack_000000b0;
  TPZVec<Fad<double>_> toro;
  Fad<double> *in_stack_fffffffffffffdd0;
  FadExpr<FadFuncSin<Fad<double>_>_> *this_00;
  double *in_stack_fffffffffffffdd8;
  TPZVec<Fad<double>_> *copy;
  Fad<double> *in_stack_fffffffffffffde0;
  TPZVec<Fad<double>_> *this_01;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *fadexpr;
  FadExpr<FadFuncSin<Fad<double>_>_> *in_stack_fffffffffffffe00;
  Fad<double> *in_stack_fffffffffffffe08;
  FadExpr<FadFuncSin<Fad<double>_>_> *in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe18;
  Fad<double> *in_stack_fffffffffffffe30;
  int64_t in_stack_fffffffffffffe38;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffe40;
  TPZVec<Fad<double>_> local_40;
  TPZVec<Fad<double>_> *local_20;
  
  local_20 = in_RCX;
  TPZGeoTriangle::X<Fad<double>>(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  TPZVec<Fad<double>_>::TPZVec
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  Fad<double>::~Fad(in_stack_fffffffffffffdd0);
  this_01 = (TPZVec<Fad<double>_> *)in_RDI[1]._vptr_TPZVec;
  fadexpr = *(FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> **)
             &in_RDI[1].fStore;
  TPZVec<Fad<double>_>::operator[](local_20,0);
  cos<double>(in_stack_fffffffffffffe08);
  operator*<double,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
            (in_stack_fffffffffffffe18,
             (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffe10);
  operator+<double,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_nullptr>
            (in_stack_fffffffffffffe18,
             (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
             in_stack_fffffffffffffe10);
  TPZVec<Fad<double>_>::operator[](local_20,1);
  cos<double>(in_stack_fffffffffffffe08);
  operator*<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
              *)in_stack_fffffffffffffe08,
             (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffe00);
  TPZVec<Fad<double>_>::operator[](&local_40,0);
  Fad<double>::operator=
            ((Fad<double> *)in_RDI,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
              *)fadexpr);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
              *)in_stack_fffffffffffffdd0);
  FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffdd0);
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
              *)in_stack_fffffffffffffdd0);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
             in_stack_fffffffffffffdd0);
  FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffdd0);
  this_00 = (FadExpr<FadFuncSin<Fad<double>_>_> *)in_RDI[1]._vptr_TPZVec;
  copy = *(TPZVec<Fad<double>_> **)&in_RDI[1].fStore;
  TPZVec<Fad<double>_>::operator[](local_20,0);
  cos<double>(in_stack_fffffffffffffe08);
  operator*<double,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
            (in_stack_fffffffffffffe18,
             (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffe10);
  operator+<double,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_nullptr>
            (in_stack_fffffffffffffe18,
             (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
             in_stack_fffffffffffffe10);
  TPZVec<Fad<double>_>::operator[](local_20,1);
  sin<double>(in_stack_fffffffffffffe08);
  operator*<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
              *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  TPZVec<Fad<double>_>::operator[](&local_40,1);
  Fad<double>::operator=
            ((Fad<double> *)in_RDI,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
              *)fadexpr);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
              *)this_00);
  FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr(this_00);
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
              *)this_00);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)this_00)
  ;
  FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr((FadExpr<FadFuncCos<Fad<double>_>_> *)this_00);
  TPZVec<Fad<double>_>::operator[](local_20,0);
  sin<double>(in_stack_fffffffffffffe08);
  operator*<double,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  TPZVec<Fad<double>_>::operator[](&local_40,2);
  Fad<double>::operator=((Fad<double> *)in_RDI,fadexpr);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)this_00)
  ;
  FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr(this_00);
  TPZVec<Fad<double>_>::operator=(this_01,copy);
  TPZVec<Fad<double>_>::~TPZVec(in_RDI);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            TPZGeoTriangle::X(this->fPhiTheta,loc,result);
            TPZVec <T> toro(3,0.0);
            
            toro[0] = (fR + fr*cos(result[0]))*cos(result[1]);
            toro[1] = (fR + fr*cos(result[0]))*sin(result[1]);
            toro[2] = fr*sin(result[0]);		
            result=toro;
        }